

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

RPCHelpMan * addconnection(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCResult> *in_stack_fffffffffffff3d8;
  RPCArg *this;
  anon_class_1_0_00000001 *in_stack_fffffffffffff3e0;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_fffffffffffff3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff410;
  allocator<char> *in_stack_fffffffffffff418;
  iterator in_stack_fffffffffffff420;
  RPCArgOptions *in_stack_fffffffffffff428;
  string *in_stack_fffffffffffff430;
  undefined7 in_stack_fffffffffffff438;
  undefined1 in_stack_fffffffffffff43f;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffff440;
  string *in_stack_fffffffffffff448;
  undefined1 *puVar2;
  RPCArg *in_stack_fffffffffffff450;
  RPCResults *in_stack_fffffffffffff458;
  RPCResult *in_stack_fffffffffffff460;
  undefined1 *local_b98;
  RPCExamples *examples;
  RPCResults *results;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  RPCHelpMan *name;
  RPCHelpMan *this_00;
  allocator<char> local_a2d;
  allocator<char> local_a2c;
  allocator<char> local_a2b;
  allocator<char> local_a2a [2];
  pointer local_a28;
  pointer pRStack_a20;
  pointer local_a18;
  allocator<char> local_a0a;
  allocator<char> local_a09 [31];
  allocator<char> local_9ea;
  allocator<char> local_9e9 [31];
  allocator<char> local_9ca;
  allocator<char> local_9c9 [9];
  undefined8 in_stack_fffffffffffff640;
  allocator<char> local_9a9;
  undefined4 local_9a8;
  allocator<char> local_9a2;
  allocator<char> local_9a1;
  undefined1 local_9a0 [7];
  undefined1 local_999 [8];
  RPCResults local_991;
  vector<RPCArg,_std::allocator<RPCArg>_> local_972 [16];
  undefined1 local_7f0 [272];
  undefined1 local_6e0 [200];
  undefined1 local_618;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined1 local_5d8;
  undefined1 local_5d7;
  undefined1 local_530;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined1 local_4f0;
  undefined1 local_4ef;
  undefined1 local_448;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined1 local_408;
  undefined1 local_407;
  undefined1 local_360 [792];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (RPCHelpMan *)
            ((long)&local_972[0].super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                    super__Vector_impl_data._M_start + 1);
  name = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff428,(char *)in_stack_fffffffffffff420,in_stack_fffffffffffff418);
  args = local_972;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff428,(char *)in_stack_fffffffffffff420,in_stack_fffffffffffff418);
  results = &local_991;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff428,(char *)in_stack_fffffffffffff420,in_stack_fffffffffffff418);
  local_999._1_4_ = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff3e8,(Optional *)in_stack_fffffffffffff3e0);
  examples = (RPCExamples *)local_999;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff428,(char *)in_stack_fffffffffffff420,in_stack_fffffffffffff418);
  local_448 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff3f0);
  local_420 = 0;
  uStack_418 = 0;
  local_410 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff3d8);
  local_408 = 0;
  local_407 = 0;
  RPCArg::RPCArg(in_stack_fffffffffffff450,in_stack_fffffffffffff448,
                 (Type)((ulong)in_stack_fffffffffffff440 >> 0x20),
                 (Fallback *)CONCAT17(in_stack_fffffffffffff43f,in_stack_fffffffffffff438),
                 in_stack_fffffffffffff430,in_stack_fffffffffffff428);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff428,(char *)in_stack_fffffffffffff420,in_stack_fffffffffffff418);
  local_9a0._0_4_ = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff3e8,(Optional *)in_stack_fffffffffffff3e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff428,(char *)in_stack_fffffffffffff420,in_stack_fffffffffffff418);
  local_530 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff3f0);
  local_508 = 0;
  uStack_500 = 0;
  local_4f8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff3d8);
  local_4f0 = 0;
  local_4ef = 0;
  RPCArg::RPCArg(in_stack_fffffffffffff450,in_stack_fffffffffffff448,
                 (Type)((ulong)in_stack_fffffffffffff440 >> 0x20),
                 (Fallback *)CONCAT17(in_stack_fffffffffffff43f,in_stack_fffffffffffff438),
                 in_stack_fffffffffffff430,in_stack_fffffffffffff428);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff428,(char *)in_stack_fffffffffffff420,in_stack_fffffffffffff418);
  local_9a8 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff3e8,(Optional *)in_stack_fffffffffffff3e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff428,(char *)in_stack_fffffffffffff420,in_stack_fffffffffffff418);
  local_618 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff3f0);
  local_5f0 = 0;
  uStack_5e8 = 0;
  local_5e0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff3d8);
  local_5d8 = 0;
  local_5d7 = 0;
  RPCArg::RPCArg(in_stack_fffffffffffff450,in_stack_fffffffffffff448,
                 (Type)((ulong)in_stack_fffffffffffff440 >> 0x20),
                 (Fallback *)CONCAT17(in_stack_fffffffffffff43f,in_stack_fffffffffffff438),
                 in_stack_fffffffffffff430,in_stack_fffffffffffff428);
  std::allocator<RPCArg>::allocator((allocator<RPCArg> *)in_stack_fffffffffffff3d8);
  __l._M_len = (size_type)in_stack_fffffffffffff428;
  __l._M_array = in_stack_fffffffffffff420;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff418,__l,
             (allocator_type *)in_stack_fffffffffffff410);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff428,(char *)in_stack_fffffffffffff420,in_stack_fffffffffffff418);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff428,(char *)in_stack_fffffffffffff420,in_stack_fffffffffffff418);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff428,(char *)in_stack_fffffffffffff420,in_stack_fffffffffffff418);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff428,(char *)in_stack_fffffffffffff420,in_stack_fffffffffffff418);
  local_a09[1] = (allocator<char>)0x0;
  local_a09[2] = (allocator<char>)0x0;
  local_a09[3] = (allocator<char>)0x0;
  local_a09[4] = (allocator<char>)0x0;
  local_a09[5] = (allocator<char>)0x0;
  local_a09[6] = (allocator<char>)0x0;
  local_a09[7] = (allocator<char>)0x0;
  local_a09[8] = (allocator<char>)0x0;
  local_a09[9] = (allocator<char>)0x0;
  local_a09[10] = (allocator<char>)0x0;
  local_a09[0xb] = (allocator<char>)0x0;
  local_a09[0xc] = (allocator<char>)0x0;
  local_a09[0xd] = (allocator<char>)0x0;
  local_a09[0xe] = (allocator<char>)0x0;
  local_a09[0xf] = (allocator<char>)0x0;
  local_a09[0x10] = (allocator<char>)0x0;
  local_a09[0x11] = (allocator<char>)0x0;
  local_a09[0x12] = (allocator<char>)0x0;
  local_a09[0x13] = (allocator<char>)0x0;
  local_a09[0x14] = (allocator<char>)0x0;
  local_a09[0x15] = (allocator<char>)0x0;
  local_a09[0x16] = (allocator<char>)0x0;
  local_a09[0x17] = (allocator<char>)0x0;
  local_a09[0x18] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff3d8);
  RPCResult::RPCResult
            (in_stack_fffffffffffff460,(Type)((ulong)in_stack_fffffffffffff458 >> 0x20),
             &in_stack_fffffffffffff450->m_names,in_stack_fffffffffffff448,in_stack_fffffffffffff440
             ,(bool)in_stack_fffffffffffff43f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff428,(char *)in_stack_fffffffffffff420,in_stack_fffffffffffff418);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff428,(char *)in_stack_fffffffffffff420,in_stack_fffffffffffff418);
  local_a28 = (pointer)0x0;
  pRStack_a20 = (pointer)0x0;
  local_a18 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff3d8);
  RPCResult::RPCResult
            (in_stack_fffffffffffff460,(Type)((ulong)in_stack_fffffffffffff458 >> 0x20),
             &in_stack_fffffffffffff450->m_names,in_stack_fffffffffffff448,in_stack_fffffffffffff440
             ,(bool)in_stack_fffffffffffff43f);
  std::allocator<RPCResult>::allocator(in_stack_fffffffffffff3d8);
  __l_00._M_len = (size_type)in_stack_fffffffffffff428;
  __l_00._M_array = (iterator)in_stack_fffffffffffff420;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff418,__l_00,
             (allocator_type *)in_stack_fffffffffffff410);
  RPCResult::RPCResult
            (in_stack_fffffffffffff460,(Type)((ulong)in_stack_fffffffffffff458 >> 0x20),
             &in_stack_fffffffffffff450->m_names,in_stack_fffffffffffff448,in_stack_fffffffffffff440
             ,(bool)in_stack_fffffffffffff43f);
  RPCResults::RPCResults(in_stack_fffffffffffff458,(RPCResult *)in_stack_fffffffffffff450);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff428,(char *)in_stack_fffffffffffff420,in_stack_fffffffffffff418);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff428,(char *)in_stack_fffffffffffff420,in_stack_fffffffffffff418);
  HelpExampleCli(in_stack_fffffffffffff410,in_stack_fffffffffffff408);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff428,(char *)in_stack_fffffffffffff420,in_stack_fffffffffffff418);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff428,(char *)in_stack_fffffffffffff420,in_stack_fffffffffffff418);
  HelpExampleRpc(in_stack_fffffffffffff410,in_stack_fffffffffffff408);
  std::operator+(in_stack_fffffffffffff410,in_stack_fffffffffffff408);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_fffffffffffff3d8,(string *)0x653128);
  this = (RPCArg *)&stack0xfffffffffffff5b0;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<addconnection()::__0,void>(in_stack_fffffffffffff3e8,in_stack_fffffffffffff3e0);
  RPCHelpMan::RPCHelpMan
            (this_00,&name->m_name,&in_RDI->m_name,args,results,examples,
             (RPCMethodImpl *)in_stack_fffffffffffff640);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_a2d);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_a2c);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_a2b);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_a2a);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff3e8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  puVar2 = local_7f0;
  local_b98 = local_6e0;
  do {
    local_b98 = local_b98 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_b98 != puVar2);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff3e8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_a0a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_a09);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff3e8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_9ea);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_9e9);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_9ca);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_9c9);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff3e8);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  puVar2 = local_360;
  puVar1 = local_48;
  do {
    puVar1 = puVar1 + -0x108;
    RPCArg::~RPCArg(this);
  } while (puVar1 != puVar2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_9a9);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_9a2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_9a1);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_9a0 + 6));
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_999);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_991);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_972);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&local_972[0].super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                     super__Vector_impl_data._M_start + 1));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return name;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan addconnection()
{
    return RPCHelpMan{"addconnection",
        "\nOpen an outbound connection to a specified node. This RPC is for testing only.\n",
        {
            {"address", RPCArg::Type::STR, RPCArg::Optional::NO, "The IP address and port to attempt connecting to."},
            {"connection_type", RPCArg::Type::STR, RPCArg::Optional::NO, "Type of connection to open (\"outbound-full-relay\", \"block-relay-only\", \"addr-fetch\" or \"feeler\")."},
            {"v2transport", RPCArg::Type::BOOL, RPCArg::Optional::NO, "Attempt to connect using BIP324 v2 transport protocol"},
        },
        RPCResult{
            RPCResult::Type::OBJ, "", "",
            {
                { RPCResult::Type::STR, "address", "Address of newly added connection." },
                { RPCResult::Type::STR, "connection_type", "Type of connection opened." },
            }},
        RPCExamples{
            HelpExampleCli("addconnection", "\"192.168.0.6:8333\" \"outbound-full-relay\" true")
            + HelpExampleRpc("addconnection", "\"192.168.0.6:8333\" \"outbound-full-relay\" true")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    if (Params().GetChainType() != ChainType::REGTEST) {
        throw std::runtime_error("addconnection is for regression testing (-regtest mode) only.");
    }

    const std::string address = request.params[0].get_str();
    const std::string conn_type_in{TrimString(request.params[1].get_str())};
    ConnectionType conn_type{};
    if (conn_type_in == "outbound-full-relay") {
        conn_type = ConnectionType::OUTBOUND_FULL_RELAY;
    } else if (conn_type_in == "block-relay-only") {
        conn_type = ConnectionType::BLOCK_RELAY;
    } else if (conn_type_in == "addr-fetch") {
        conn_type = ConnectionType::ADDR_FETCH;
    } else if (conn_type_in == "feeler") {
        conn_type = ConnectionType::FEELER;
    } else {
        throw JSONRPCError(RPC_INVALID_PARAMETER, self.ToString());
    }
    bool use_v2transport{self.Arg<bool>("v2transport")};

    NodeContext& node = EnsureAnyNodeContext(request.context);
    CConnman& connman = EnsureConnman(node);

    if (use_v2transport && !(connman.GetLocalServices() & NODE_P2P_V2)) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "Error: Adding v2transport connections requires -v2transport init flag to be set.");
    }

    const bool success = connman.AddConnection(address, conn_type, use_v2transport);
    if (!success) {
        throw JSONRPCError(RPC_CLIENT_NODE_CAPACITY_REACHED, "Error: Already at capacity for specified connection type.");
    }

    UniValue info(UniValue::VOBJ);
    info.pushKV("address", address);
    info.pushKV("connection_type", conn_type_in);

    return info;
},
    };
}